

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::objectivec::ProtobufFrameworkImportSymbol
                   (string *__return_storage_ptr__,string *framework_name)

{
  pointer pcVar1;
  long lVar2;
  string out;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"GPB_USE_","");
  pcVar1 = (framework_name->_M_dataplus)._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + framework_name->_M_string_length);
  if (local_38 != 0) {
    lVar2 = 0;
    do {
      if ((byte)(local_40[lVar2] + 0x9f) < 0x1a) {
        local_40[lVar2] = local_40[lVar2] + -0x20;
      }
      lVar2 = lVar2 + 1;
    } while (local_38 != lVar2);
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ProtobufFrameworkImportSymbol(const std::string& framework_name) {
  // GPB_USE_[framework_name]_FRAMEWORK_IMPORTS
  std::string result = std::string("GPB_USE_");
  result += ToUpper(framework_name);
  result += "_FRAMEWORK_IMPORTS";
  return result;
}